

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionTest_InvalidPolicyWithDuplicatePolicyOid_Test
::~ParseCertificatePoliciesExtensionTest_InvalidPolicyWithDuplicatePolicyOid_Test
          (ParseCertificatePoliciesExtensionTest_InvalidPolicyWithDuplicatePolicyOid_Test *this)

{
  ParseCertificatePoliciesExtensionTest_InvalidPolicyWithDuplicatePolicyOid_Test *this_local;
  
  ~ParseCertificatePoliciesExtensionTest_InvalidPolicyWithDuplicatePolicyOid_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParseCertificatePoliciesExtensionTest,
     InvalidPolicyWithDuplicatePolicyOid) {
  std::string der;
  ASSERT_TRUE(LoadTestData("invalid-policy_1_2_3_dupe.pem", &der));
  std::vector<PolicyInformation> policies;
  CertErrors errors;
  EXPECT_FALSE(ParseCertificatePoliciesExtension(StringAsBytes(der), &policies,
                                                 &errors));
}